

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkNullableIndex(CheckerVisitor *this,GetSlotExpr *expr)

{
  bool bVar1;
  CheckerVisitor *this_00;
  Node *n;
  SlotAccessExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *key;
  Expr *in_stack_00000028;
  CheckerVisitor *in_stack_00000030;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = (CheckerVisitor *)SlotAccessExpr::key(in_RSI);
    bVar1 = isSafeAccess(this_00,(AccessExpr *)in_RDI);
    if ((!bVar1) && (bVar1 = isPotentiallyNullable(in_stack_00000030,in_stack_00000028), bVar1)) {
      n = &SlotAccessExpr::key(in_RSI)->super_Node;
      report(in_RDI,n,0x41);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkNullableIndex(const GetSlotExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *key = expr->key();

  if (!isSafeAccess(expr) && isPotentiallyNullable(key)) {
    report(expr->key(), DiagnosticsId::DI_POTENTIALLY_NULLABLE_INDEX);
  }
}